

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

uint32_t utf8_len(char *s,uint32_t nbytes)

{
  byte bVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  
  if (nbytes == 0) {
    sVar3 = strlen(s);
    nbytes = (uint32_t)sVar3;
  }
  uVar4 = 0;
  uVar2 = 0;
  do {
    if (nbytes <= uVar4) {
      return uVar2;
    }
    bVar1 = s[uVar4];
    iVar5 = 1;
    if ((((char)bVar1 < '\x01') && (iVar5 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
       (iVar5 = 3, (bVar1 & 0xf0) != 0xe0)) {
      iVar5 = (uint)((byte)(bVar1 + 0x10) < 5) << 2;
    }
    uVar4 = uVar4 + iVar5;
    uVar2 = uVar2 + 1;
  } while (iVar5 != 0);
  return 0;
}

Assistant:

uint32_t utf8_len (const char *s, uint32_t nbytes) {
    if (nbytes == 0) nbytes = (uint32_t)strlen(s);
    
    uint32_t pos = 0;
    uint32_t len = 0;
    
    while (pos < nbytes) {
        ++len;
        uint32_t n = utf8_charbytes(s, pos);
        if (n == 0) return 0; // means error
        pos += n;
    }
    
    return len;
}